

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempLivnessFiller.cpp
# Opt level: O1

int processCodeLine(CodeLine *codeLine)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  pointer pcVar1;
  pointer ppCVar2;
  undefined8 uVar3;
  int iVar4;
  iterator iVar5;
  _Base_ptr p_Var6;
  _Rb_tree_node_base *p_Var7;
  bool bVar8;
  pointer pCVar9;
  undefined8 uVar10;
  CodeLine *pCVar11;
  pointer ppCVar12;
  bool bVar13;
  CTemp useTemp;
  CTemp outTemp;
  int local_d4;
  key_type local_d0;
  CodeLine *local_b0;
  _Base_ptr local_a8;
  string local_a0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_80;
  _Rb_tree_node_base *local_78;
  _Rb_tree_node_base *local_70;
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  (**((codeLine->command).
      super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_AssemblyCommand)(local_68);
  local_b0 = (CodeLine *)local_68._8_8_;
  if (local_68._0_8_ == local_68._8_8_) {
    local_d4 = 0;
  }
  else {
    local_a8 = &(codeLine->liveInTemps)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_d4 = 0;
    pCVar9 = (pointer)local_68._0_8_;
    do {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      pcVar1 = (pCVar9->name)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar1,pcVar1 + (pCVar9->name)._M_string_length);
      IRT::CTemp::ToString_abi_cxx11_(&local_a0,(CTemp *)&local_d0);
      iVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(codeLine->liveInTemps)._M_t,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if (iVar5._M_node == local_a8) {
        IRT::CTemp::ToString_abi_cxx11_(&local_a0,(CTemp *)&local_d0);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&codeLine->liveInTemps,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        local_d4 = local_d4 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      pCVar9 = pCVar9 + 1;
    } while ((CodeLine *)pCVar9 != local_b0);
  }
  std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector
            ((vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *)local_68);
  p_Var6 = (codeLine->liveInTemps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8 = &(codeLine->liveInTemps)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_b0 = codeLine;
  if (p_Var6 != local_a8) {
    do {
      pCVar11 = local_b0;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,*(long *)(p_Var6 + 1),
                 (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
      ppCVar2 = (pCVar11->prevLines).
                super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar12 = (pCVar11->prevLines).
                      super__Vector_base<AssemblyCode::CodeLine_*,_std::allocator<AssemblyCode::CodeLine_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppCVar12 != ppCVar2;
          ppCVar12 = ppCVar12 + 1) {
        pCVar11 = *ppCVar12;
        this = &pCVar11->liveOutTemps;
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&this->_M_t,&local_d0);
        if ((_Rb_tree_header *)iVar5._M_node ==
            &(pCVar11->liveOutTemps)._M_t._M_impl.super__Rb_tree_header) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this,&local_d0);
          local_d4 = local_d4 + 1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_a8);
  }
  p_Var7 = (local_b0->liveOutTemps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_78 = &(local_b0->liveOutTemps)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var7 != local_78) {
    local_80 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&local_b0->liveInTemps;
    pCVar11 = local_b0;
    do {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,*(long *)(p_Var7 + 1),
                 (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
      (*((pCVar11->command).
         super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_AssemblyCommand[1])(&local_48);
      uVar3 = local_48._8_8_;
      if (local_48._M_allocated_capacity == local_48._8_8_) {
        std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector
                  ((vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *)&local_48);
LAB_00154c97:
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_80,&local_d0);
        pCVar11 = local_b0;
        if (iVar5._M_node == local_a8) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>(local_80,&local_d0);
          local_d4 = local_d4 + 1;
        }
      }
      else {
        bVar8 = false;
        uVar10 = local_48._M_allocated_capacity;
        local_70 = p_Var7;
        do {
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,*(long *)uVar10,*(long *)(uVar10 + 8) + *(long *)uVar10);
          IRT::CTemp::ToString_abi_cxx11_((string *)local_68,(CTemp *)&local_a0);
          if (local_68._8_8_ == local_d0._M_string_length) {
            if ((pointer)local_68._8_8_ == (pointer)0x0) {
              bVar13 = true;
            }
            else {
              iVar4 = bcmp((void *)local_68._0_8_,local_d0._M_dataplus._M_p,local_68._8_8_);
              bVar13 = iVar4 == 0;
            }
          }
          else {
            bVar13 = false;
          }
          if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
            operator_delete((void *)local_68._0_8_);
          }
          if (bVar13) {
            bVar8 = true;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          uVar10 = uVar10 + 0x20;
        } while (!(bool)(bVar13 | uVar10 == uVar3));
        std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector
                  ((vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> *)&local_48);
        p_Var7 = local_70;
        pCVar11 = local_b0;
        if (!bVar8) goto LAB_00154c97;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_78);
  }
  return local_d4;
}

Assistant:

int processCodeLine(AssemblyCode::CodeLine* codeLine) {
    int changesCount = 0;

    for (auto useTemp : codeLine->command->GetIn()) {
        if (codeLine->liveInTemps.find(useTemp.ToString()) == codeLine->liveInTemps.end()) {
            changesCount += 1;
            codeLine->liveInTemps.insert(useTemp.ToString());
        }
    }

    for (auto liveInTemp : codeLine->liveInTemps) {
        for (auto prevLine : codeLine->prevLines) {
            if (prevLine->liveOutTemps.find(liveInTemp) == prevLine->liveOutTemps.end()) {
                changesCount += 1;
                prevLine->liveOutTemps.insert(liveInTemp);
            }
        }
    }

    for (auto liveOutTemp : codeLine->liveOutTemps) {
        bool found = false;
        for (auto outTemp : codeLine->command->GetOut()) {
            if (outTemp.ToString() == liveOutTemp) {
                found = true;
                break;
            }
        }

        if (!found) {
            if (codeLine->liveInTemps.find(liveOutTemp) == codeLine->liveInTemps.end()) {
                changesCount += 1;
                codeLine->liveInTemps.insert(liveOutTemp);
            }
        }
    }

    return changesCount;
}